

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O1

void cpu_change_pstate_sparc64(CPUSPARCState_conflict1 *env,uint32_t new_pstate)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  if (((env->def).features & 0x2000) == 0) {
    uVar3 = new_pstate & 0xc01;
    uVar2 = env->pstate & 0xc01;
    if (uVar3 != uVar2) {
      if (uVar3 == 0x800) {
        lVar1 = 0x1ce8;
      }
      else if (uVar3 == 0x400) {
        lVar1 = 0x1d28;
      }
      else {
        lVar1 = 0x1ca8;
        if (uVar3 == 1) {
          lVar1 = 0x1c68;
        }
      }
      if (uVar2 == 0x800) {
        lVar4 = 0x1ce8;
      }
      else if (uVar2 == 0x400) {
        lVar4 = 0x1d28;
      }
      else {
        lVar4 = 0x1ca8;
        if (uVar2 == 1) {
          lVar4 = 0x1c68;
        }
      }
      *(target_ulong *)((long)env->gregs + lVar4) = env->gregs[0];
      *(target_ulong *)((long)env->gregs + lVar4 + 8) = env->gregs[1];
      *(target_ulong *)((long)env->gregs + lVar4 + 0x10) = env->gregs[2];
      *(target_ulong *)((long)env->gregs + lVar4 + 0x18) = env->gregs[3];
      *(target_ulong *)((long)env->gregs + lVar4 + 0x20) = env->gregs[4];
      *(target_ulong *)((long)env->gregs + lVar4 + 0x28) = env->gregs[5];
      *(target_ulong *)((long)env->gregs + lVar4 + 0x30) = env->gregs[6];
      *(target_ulong *)((long)env->gregs + lVar4 + 0x38) = env->gregs[7];
      env->gregs[0] = *(target_ulong *)((long)env->gregs + lVar1);
      env->gregs[1] = *(target_ulong *)((long)env->gregs + lVar1 + 8);
      env->gregs[2] = *(target_ulong *)((long)env->gregs + lVar1 + 0x10);
      env->gregs[3] = *(target_ulong *)((long)env->gregs + lVar1 + 0x18);
      env->gregs[4] = *(target_ulong *)((long)env->gregs + lVar1 + 0x20);
      env->gregs[5] = *(target_ulong *)((long)env->gregs + lVar1 + 0x28);
      env->gregs[6] = *(target_ulong *)((long)env->gregs + lVar1 + 0x30);
      env->gregs[7] = *(target_ulong *)((long)env->gregs + lVar1 + 0x38);
    }
  }
  else {
    new_pstate = new_pstate & 0xfffff3fe;
  }
  env->pstate = new_pstate;
  return;
}

Assistant:

void cpu_change_pstate(CPUSPARCState *env, uint32_t new_pstate)
{
    uint32_t pstate_regs, new_pstate_regs;
    uint64_t *src, *dst;

    if (env->def.features & CPU_FEATURE_GL) {
        /* PS_AG, IG and MG are not implemented in this case */
        new_pstate &= ~(PS_AG | PS_IG | PS_MG);
        env->pstate = new_pstate;
        return;
    }

    pstate_regs = env->pstate & 0xc01;
    new_pstate_regs = new_pstate & 0xc01;

    if (new_pstate_regs != pstate_regs) {
        /* Switch global register bank */
        src = get_gregset(env, new_pstate_regs);
        dst = get_gregset(env, pstate_regs);
        memcpy32(dst, env->gregs);
        memcpy32(env->gregs, src);
    }
    env->pstate = new_pstate;
}